

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O2

WaitResult<bool> __thiscall FindUserDataCallable::operator()(FindUserDataCallable *this)

{
  __type _Var1;
  byte bVar2;
  _List_node_base *p_Var3;
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> peers;
  _List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> local_30;
  
  udpdiscovery::Peer::ListDiscovered_abi_cxx11_
            ((list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> *)
             &local_30,this->peer_);
  p_Var3 = (_List_node_base *)&local_30;
  do {
    p_Var3 = (((_List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&local_30) {
      bVar2 = 0;
      goto LAB_0010811d;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &p_Var3[1]._M_prev,&this->user_data_);
  } while (!_Var1);
  bVar2 = 1;
LAB_0010811d:
  std::__cxx11::
  _List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::_M_clear
            (&local_30);
  return (WaitResult<bool>)((uint3)bVar2 << 8 | 0x10000);
}

Assistant:

WaitResult<bool> operator()() {
    std::list<udpdiscovery::DiscoveredPeer> peers = peer_.ListDiscovered();
    for (std::list<udpdiscovery::DiscoveredPeer>::iterator it = peers.begin();
         it != peers.end(); ++it) {
      if ((*it).user_data() == user_data_) {
        WaitResult<bool> result;
        result.has_result = true;
        result.result = true;

        return result;
      }
    }

    return WaitResult<bool>();
  }